

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_244c45::ImageOptimizer::ImageOptimizer
          (ImageOptimizer *this,QPDFJob *o,size_t oi_min_width,size_t oi_min_height,
          size_t oi_min_area,int quality,QPDFObjectHandle *image)

{
  anon_class_4_1_aa2af3df local_64;
  function<void_(jpeg_compress_struct_*)> local_60;
  undefined1 local_40 [20];
  int quality_local;
  size_t oi_min_area_local;
  size_t oi_min_height_local;
  size_t oi_min_width_local;
  QPDFJob *o_local;
  ImageOptimizer *this_local;
  
  local_40._12_4_ = quality;
  unique0x10000139 = oi_min_area;
  oi_min_area_local = oi_min_height;
  oi_min_height_local = oi_min_width;
  oi_min_width_local = (size_t)o;
  o_local = (QPDFJob *)this;
  QPDFObjectHandle::StreamDataProvider::StreamDataProvider(&this->super_StreamDataProvider,false);
  (this->super_StreamDataProvider)._vptr_StreamDataProvider =
       (_func_int **)&PTR__ImageOptimizer_0058c7e8;
  this->o = (QPDFJob *)oi_min_width_local;
  this->oi_min_width = oi_min_height_local;
  this->oi_min_height = oi_min_area_local;
  this->oi_min_area = stack0xffffffffffffffd0;
  this->decode_level = qpdf_dl_specialized;
  QPDFObjectHandle::QPDFObjectHandle(&this->image,image);
  std::shared_ptr<Pl_DCT::CompressConfig>::shared_ptr(&this->config);
  if (-1 < (int)local_40._12_4_) {
    this->decode_level = qpdf_dl_all;
    local_64.quality = local_40._12_4_;
    std::function<void(jpeg_compress_struct*)>::
    function<(anonymous_namespace)::ImageOptimizer::ImageOptimizer(QPDFJob&,unsigned_long,unsigned_long,unsigned_long,int,QPDFObjectHandle&)::__0,void>
              ((function<void(jpeg_compress_struct*)> *)&local_60,&local_64);
    Pl_DCT::make_compress_config((Pl_DCT *)local_40,&local_60);
    std::shared_ptr<Pl_DCT::CompressConfig>::operator=
              (&this->config,
               (unique_ptr<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>_> *)
               local_40);
    std::unique_ptr<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>_>::
    ~unique_ptr((unique_ptr<Pl_DCT::CompressConfig,_std::default_delete<Pl_DCT::CompressConfig>_> *)
                local_40);
    std::function<void_(jpeg_compress_struct_*)>::~function(&local_60);
  }
  return;
}

Assistant:

ImageOptimizer::ImageOptimizer(
    QPDFJob& o,
    size_t oi_min_width,
    size_t oi_min_height,
    size_t oi_min_area,
    int quality,
    QPDFObjectHandle& image) :
    o(o),
    oi_min_width(oi_min_width),
    oi_min_height(oi_min_height),
    oi_min_area(oi_min_area),
    image(image)
{
    if (quality >= 0) {
        // Recompress existing jpeg.
        decode_level = qpdf_dl_all;
        config = Pl_DCT::make_compress_config(
            [quality](jpeg_compress_struct* cinfo) { jpeg_set_quality(cinfo, quality, false); });
    }
}